

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

size_t kex_method_strlen(LIBSSH2_COMMON_METHOD **method)

{
  LIBSSH2_COMMON_METHOD *pLVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  LIBSSH2_COMMON_METHOD **ppLVar5;
  
  if ((method == (LIBSSH2_COMMON_METHOD **)0x0) ||
     (pLVar1 = *method, pLVar1 == (LIBSSH2_COMMON_METHOD *)0x0)) {
    sVar4 = 0;
  }
  else {
    lVar3 = 0;
    ppLVar5 = method + 1;
    while ((pLVar1 != (LIBSSH2_COMMON_METHOD *)0x0 && (pLVar1->name != (char *)0x0))) {
      sVar2 = strlen(pLVar1->name);
      lVar3 = lVar3 + sVar2 + 1;
      pLVar1 = *ppLVar5;
      ppLVar5 = ppLVar5 + 1;
    }
    sVar4 = lVar3 - 1;
  }
  return sVar4;
}

Assistant:

static size_t
kex_method_strlen(LIBSSH2_COMMON_METHOD ** method)
{
    size_t len = 0;

    if(!method || !*method) {
        return 0;
    }

    while(*method && (*method)->name) {
        len += strlen((*method)->name) + 1;
        method++;
    }

    return len - 1;
}